

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

int lobjectid(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  time_t tVar4;
  uint32_t id;
  time_t ti;
  int i;
  char *str;
  size_t len;
  undefined2 uStack_20;
  uint8_t oid [14];
  lua_State *L_local;
  
  len._2_2_ = 0x700;
  len._4_1_ = 0;
  len._5_1_ = 0;
  len._6_1_ = 0;
  len._7_1_ = 0;
  uStack_20 = 0;
  oid[0] = '\0';
  oid[1] = '\0';
  oid[2] = '\0';
  oid[3] = '\0';
  oid[4] = '\0';
  oid[5] = '\0';
  oid._6_8_ = L;
  iVar1 = lua_isstring(L,1);
  if (iVar1 == 0) {
    tVar4 = time((time_t *)0x0);
    LOCK();
    UNLOCK();
    len._4_1_ = (undefined1)((ulong)tVar4 >> 0x18);
    len._5_1_ = (undefined1)((ulong)tVar4 >> 0x10);
    len._6_1_ = (undefined1)((ulong)tVar4 >> 8);
    len._7_1_ = (undefined1)tVar4;
    uStack_20 = (undefined2)oid_header._0_4_;
    oid._0_2_ = SUB42(oid_header._0_4_,2);
    oid[2] = oid_header[4];
    oid[3] = (uint8_t)(oid_counter >> 0x10);
    oid[5] = (uint8_t)oid_counter;
    oid[4] = (uint8_t)(oid_counter >> 8);
    oid_counter = oid_counter + 1;
  }
  else {
    pcVar3 = lua_tolstring((lua_State *)oid._6_8_,1,(size_t *)&str);
    if (str != (char *)0x18) {
      iVar1 = luaL_error((lua_State *)oid._6_8_,"Invalid objectid %s",pcVar3);
      return iVar1;
    }
    for (ti._4_4_ = 0; ti._4_4_ < 0xc; ti._4_4_ = ti._4_4_ + 1) {
      iVar1 = hextoint(pcVar3[ti._4_4_ << 1]);
      iVar2 = hextoint(pcVar3[ti._4_4_ * 2 + 1]);
      *(byte *)((long)&len + (long)(ti._4_4_ + 2) + 2) = (byte)(iVar1 << 4) | (byte)iVar2;
    }
  }
  lua_pushlstring((lua_State *)oid._6_8_,(char *)((long)&len + 2),0xe);
  return 1;
}

Assistant:

static int
lobjectid(lua_State *L) {
	uint8_t oid[14] = { 0, BSON_OBJECTID };
	if (lua_isstring(L,1)) {
		size_t len;
		const char * str = lua_tolstring(L,1,&len);
		if (len != 24) {
			return luaL_error(L, "Invalid objectid %s", str);
		}
		int i;
		for (i=0;i<12;i++) {
			oid[i+2] = hextoint(str[i*2]) << 4 | hextoint(str[i*2+1]);
		}
	} else {
		time_t ti = time(NULL);
		// old_counter is a static var, use atom inc.
		uint32_t id = ATOM_FINC(&oid_counter);

		oid[2] = (ti>>24) & 0xff;
		oid[3] = (ti>>16) & 0xff;
		oid[4] = (ti>>8) & 0xff;
		oid[5] = ti & 0xff;
		memcpy(oid+6 , oid_header, 5);
		oid[11] = (id>>16) & 0xff; 
		oid[12] = (id>>8) & 0xff; 
		oid[13] = id & 0xff;
	}
	lua_pushlstring( L, (const char *)oid, 14);

	return 1;
}